

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void handle_struct_assign(Vm *vm)

{
  TokenType TVar1;
  Vm *vm_local;
  
  TVar1 = (vm->compiler).token.type;
  if (TVar1 == TOKEN_PLUS_PLUS) {
    advance(vm);
    emit_no_arg(vm,OP_STRUCT_PEEK);
    emit_no_arg(vm,OP_LDC_1);
    emit_no_arg(vm,OP_ADD);
    emit_no_arg(vm,OP_STRUCT_SET);
  }
  else if (TVar1 == TOKEN_MINUS_MINUS) {
    advance(vm);
    emit_no_arg(vm,OP_STRUCT_PEEK);
    emit_no_arg(vm,OP_LDC_1);
    emit_no_arg(vm,OP_SUB);
    emit_no_arg(vm,OP_STRUCT_SET);
  }
  else if (TVar1 == TOKEN_EQUALS) {
    advance(vm);
    expr(vm);
    emit_no_arg(vm,OP_STRUCT_SET);
  }
  else {
    emit_no_arg(vm,OP_STRUCT_GET);
  }
  return;
}

Assistant:

static void handle_struct_assign(Vm *vm) {
    switch (vm->compiler.token.type) {
        case TOKEN_EQUALS:
            advance(vm);
            expr(vm);
            emit_no_arg(vm, OP_STRUCT_SET);
            return;
        case TOKEN_PLUS_PLUS:
            advance(vm);
            emit_no_arg(vm, OP_STRUCT_PEEK);
            emit_no_arg(vm, OP_LDC_1);
            emit_no_arg(vm, OP_ADD);
            emit_no_arg(vm, OP_STRUCT_SET);
            return;
        case TOKEN_MINUS_MINUS:
            advance(vm);
            emit_no_arg(vm, OP_STRUCT_PEEK);
            emit_no_arg(vm, OP_LDC_1);
            emit_no_arg(vm, OP_SUB);
            emit_no_arg(vm, OP_STRUCT_SET);
            return;
        default:
            emit_no_arg(vm, OP_STRUCT_GET);
            break;
    }
}